

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VMin_Serial(N_Vector x)

{
  sunrealtype *psVar1;
  sunrealtype *xd;
  sunrealtype min;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  
  psVar1 = *(sunrealtype **)((long)x->content + 0x10);
  min = *psVar1;
  for (i = 1; i < *x->content; i = i + 1) {
    if (psVar1[i] < min) {
      min = psVar1[i];
    }
  }
  return min;
}

Assistant:

sunrealtype N_VMin_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype min, *xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  min = xd[0];

  for (i = 1; i < N; i++)
  {
    if (xd[i] < min) { min = xd[i]; }
  }

  return (min);
}